

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::(anonymous_namespace)::TokenizerTest_Errors_DD::
DoSingleCase<google::protobuf::io::(anonymous_namespace)::ErrorCase,int>
          (TokenizerTest_Errors_DD *this,ErrorCase *kErrorCases_case,int *kBlockSizes_case)

{
  bool bVar1;
  int size;
  void *data;
  Token *pTVar2;
  char *pcVar3;
  char *in_R9;
  string local_1b0;
  AssertHelper local_190;
  Message local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_;
  Message local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar;
  undefined1 local_148 [7];
  bool last_was_foo;
  Tokenizer tokenizer;
  undefined1 local_78 [8];
  TestErrorCollector error_collector;
  TestInputStream input;
  int *kBlockSizes_case_local;
  ErrorCase *kErrorCases_case_local;
  TokenizerTest_Errors_DD *this_local;
  
  data = (void *)std::__cxx11::string::data();
  size = std::__cxx11::string::size();
  io::anon_unknown_0::TestInputStream::TestInputStream
            ((TestInputStream *)((long)&error_collector.text_.field_2 + 8),data,size,
             *kBlockSizes_case);
  io::anon_unknown_0::TestErrorCollector::TestErrorCollector((TestErrorCollector *)local_78);
  Tokenizer::Tokenizer
            ((Tokenizer *)local_148,
             (ZeroCopyInputStream *)((long)&error_collector.text_.field_2 + 8),
             (ErrorCollector *)local_78);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._7_1_ = false;
  while (bVar1 = Tokenizer::Next((Tokenizer *)local_148), bVar1) {
    pTVar2 = Tokenizer::current((Tokenizer *)local_148);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._7_1_ = std::operator==(&pTVar2->text,"foo");
  }
  testing::internal::EqHelper::
  Compare<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_160,"kErrorCases_case.errors","error_collector.text_",
             &kErrorCases_case->errors,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&error_collector);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x4ae,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  if ((kErrorCases_case->recoverable & 1U) != 0) {
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_180,
               (bool *)((long)&gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       + 7),(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
    if (!bVar1) {
      testing::Message::Message(&local_188);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_1b0,(internal *)local_180,(AssertionResult *)"last_was_foo","false","true",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_190,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0x4b2,pcVar3);
      testing::internal::AssertHelper::operator=(&local_190,&local_188);
      testing::internal::AssertHelper::~AssertHelper(&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      testing::Message::~Message(&local_188);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  }
  Tokenizer::~Tokenizer((Tokenizer *)local_148);
  io::anon_unknown_0::TestErrorCollector::~TestErrorCollector((TestErrorCollector *)local_78);
  io::anon_unknown_0::TestInputStream::~TestInputStream
            ((TestInputStream *)((long)&error_collector.text_.field_2 + 8));
  return;
}

Assistant:

TEST_2D(TokenizerTest, Errors, kErrorCases, kBlockSizes) {
  // Set up the tokenizer.
  TestInputStream input(kErrorCases_case.input.data(),
                        kErrorCases_case.input.size(), kBlockSizes_case);
  TestErrorCollector error_collector;
  Tokenizer tokenizer(&input, &error_collector);

  // Ignore all input, except remember if the last token was "foo".
  bool last_was_foo = false;
  while (tokenizer.Next()) {
    last_was_foo = tokenizer.current().text == "foo";
  }

  // Check that the errors match what was expected.
  EXPECT_EQ(kErrorCases_case.errors, error_collector.text_);

  // If the error was recoverable, make sure we saw "foo" after it.
  if (kErrorCases_case.recoverable) {
    EXPECT_TRUE(last_was_foo);
  }
}